

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginGlobal
          (BinaryReaderInterp *this,Index index,Type type,bool mutable_)

{
  Result RVar1;
  GlobalType global_type;
  value_type local_60;
  GlobalDesc local_48;
  
  RVar1 = SharedValidator::OnGlobal
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     type,mutable_);
  if (RVar1.enum_ != Error) {
    local_60.super_ExternType.kind = Global;
    local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0970;
    local_60.mut = (Mutability)mutable_;
    local_48.type.super_ExternType.kind = Global;
    local_48.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0970;
    local_48.type._12_8_ = ZEXT58(CONCAT14(mutable_,type.enum_));
    local_48.init.kind = None;
    local_48.init._4_4_ = 0;
    local_48.init.field_1.i64_ = 0;
    local_48.init.field_1._8_8_ = 0;
    local_60.super_ExternType._12_4_ = type.enum_;
    std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
    emplace_back<wabt::interp::GlobalDesc>(&this->module_->globals,&local_48);
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,&local_60);
    (this->init_expr_).kind = None;
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginGlobal(Index index, Type type, bool mutable_) {
  CHECK_RESULT(validator_.OnGlobal(loc, type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  module_.globals.push_back(GlobalDesc{global_type, InitExpr{}});
  global_types_.push_back(global_type);
  init_expr_.kind = InitExprKind::None;
  return Result::Ok;
}